

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_UnaryFuncPrecedence_Test::ExprWriterTest_UnaryFuncPrecedence_Test
          (ExprWriterTest_UnaryFuncPrecedence_Test *this)

{
  undefined8 *in_RDI;
  ExprWriterTest *in_stack_00000030;
  
  ExprWriterTest::ExprWriterTest(in_stack_00000030);
  *in_RDI = &PTR__ExprWriterTest_UnaryFuncPrecedence_Test_001ecf40;
  in_RDI[2] = &PTR__ExprWriterTest_UnaryFuncPrecedence_Test_001ecf80;
  return;
}

Assistant:

TEST_F(ExprWriterTest, UnaryFuncPrecedence) {
  auto x1 = MakeVariable(0);
  for (int i = ex::FIRST_UNARY; i < ex::LAST_UNARY; ++i) {
    ex::Kind kind = static_cast<ex::Kind>(i);
    if (kind == ex::MINUS || kind == ex::POW2)
      continue;
    CHECK_WRITE(fmt::format("{0}({0}(x1))", str(kind)),
        MakeUnary(kind, MakeUnary(kind, x1)));
    CHECK_WRITE(fmt::format("{0}(x1 + x1)", str(kind)),
        MakeUnary(kind, MakeBinary(ex::ADD, x1, x1)));
  }
}